

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,str_writer<char> *f)

{
  byte bVar1;
  size_t sVar2;
  type pcVar3;
  size_t __n;
  size_t __len;
  size_t __n_00;
  char __tmp;
  char *__src;
  size_t __len_1;
  ulong uVar4;
  unsigned_long __n2_2;
  
  uVar4 = (ulong)spec->width_;
  __n_00 = uVar4 - size;
  if (uVar4 < size || __n_00 == 0) {
    pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,size);
    __n = f->size;
    if (__n == 0) {
      return;
    }
    __src = f->s;
LAB_00132dd1:
    memmove(pcVar3,__src,__n);
    return;
  }
  pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                     ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar4);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar4 = __n_00 >> 1;
    if (1 < __n_00) {
      memset(pcVar3,(uint)bVar1,uVar4);
      pcVar3 = pcVar3 + uVar4;
    }
    sVar2 = f->size;
    if (sVar2 != 0) {
      memmove(pcVar3,f->s,sVar2);
      pcVar3 = pcVar3 + sVar2;
    }
    __n_00 = __n_00 - uVar4;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(pcVar3,(uint)bVar1,__n_00);
      __n = f->size;
      if (__n == 0) {
        return;
      }
      pcVar3 = pcVar3 + __n_00;
      __src = f->s;
      goto LAB_00132dd1;
    }
    sVar2 = f->size;
    if (sVar2 != 0) {
      memmove(pcVar3,f->s,sVar2);
      pcVar3 = pcVar3 + sVar2;
    }
  }
  memset(pcVar3,(uint)bVar1,__n_00);
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F &&f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}